

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m256i alVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  ulong uVar5;
  uint seglen;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i vH;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i vH_00;
  __m256i a_09;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  parasail_result_t *ppVar16;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  int64_t *ptr_02;
  __m256i *palVar17;
  int iVar18;
  long lVar19;
  char *pcVar20;
  undefined4 in_register_00000014;
  ulong uVar21;
  uint uVar22;
  __m256i *__return_storage_ptr__;
  ulong uVar23;
  ulong uVar24;
  char *__format;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  longlong lVar28;
  undefined8 uVar29;
  int iVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ulong size;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd58;
  undefined1 local_260 [32];
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  undefined1 local_1e0 [32];
  longlong local_a0 [4];
  ulong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar20 = "profile";
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar20 = "profile->profile64.score";
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar20 = "profile->matrix";
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar20 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar20 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "open";
        }
        else {
          if (-1 < gap) {
            uVar12 = uVar2 - 1;
            size = (ulong)uVar2 + 3 >> 2;
            uVar5 = (ulong)uVar12 % size;
            iVar14 = (int)(uVar12 / size);
            uVar34 = CONCAT44(0,open);
            iVar31 = -open;
            iVar18 = ppVar4->min;
            uVar24 = 0x8000000000000000 - (long)iVar18;
            if (iVar18 != iVar31 && SBORROW4(iVar18,iVar31) == iVar18 + open < 0) {
              uVar24 = uVar34 | 0x8000000000000000;
            }
            iVar18 = ppVar4->max;
            ppVar16 = parasail_result_new_table1((uint)((ulong)uVar2 + 3) & 0x7ffffffc,s2Len);
            if (ppVar16 != (parasail_result_t *)0x0) {
              ppVar16->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar16->flag | 0x4820802;
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign___m256i(0x20,size);
              ptr_01 = parasail_memalign___m256i(0x20,size);
              __return_storage_ptr__ = (__m256i *)(ulong)(s2Len + 1);
              ptr_02 = parasail_memalign_int64_t(0x20,(size_t)__return_storage_ptr__);
              if ((ptr_02 != (int64_t *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (__m256i *)0x0 && ptr != (__m256i *)0x0)) {
                iVar13 = s2Len - 1;
                iVar30 = 3 - iVar14;
                uVar32 = CONCAT44(0,gap);
                auVar38._8_4_ = gap;
                auVar38._0_8_ = uVar32;
                auVar38._12_4_ = 0;
                auVar38._16_4_ = gap;
                auVar38._20_4_ = 0;
                auVar38._24_4_ = gap;
                auVar38._28_4_ = 0;
                lVar33 = uVar24 + 1;
                lVar19 = 0x7ffffffffffffffe - (long)iVar18;
                uVar23 = (ulong)iVar31;
                uVar24 = uVar23;
                for (uVar21 = 0; uVar21 != size; uVar21 = uVar21 + 1) {
                  uVar25 = uVar24;
                  for (lVar26 = 0; lVar26 != 4; lVar26 = lVar26 + 1) {
                    uVar27 = uVar25;
                    if (s1_beg != 0) {
                      uVar27 = 0;
                    }
                    local_80[lVar26] = uVar27;
                    local_a0[lVar26] = uVar27 - uVar34;
                    uVar25 = uVar25 - size * uVar32;
                  }
                  palVar17 = ptr + uVar21;
                  (*palVar17)[0] = local_80[0];
                  (*palVar17)[1] = local_80[1];
                  (*palVar17)[2] = local_80[2];
                  (*palVar17)[3] = local_80[3];
                  palVar17 = ptr_01 + uVar21;
                  (*palVar17)[0] = local_a0[0];
                  (*palVar17)[1] = local_a0[1];
                  (*palVar17)[2] = local_a0[2];
                  (*palVar17)[3] = local_a0[3];
                  uVar24 = uVar24 - uVar32;
                }
                *ptr_02 = 0;
                for (palVar17 = (__m256i *)0x1; __return_storage_ptr__ != palVar17;
                    palVar17 = (__m256i *)((long)*palVar17 + 1)) {
                  iVar18 = 0;
                  if (s2_beg == 0) {
                    iVar18 = iVar31;
                  }
                  ptr_02[(long)palVar17] = (long)iVar18;
                  iVar31 = iVar31 - gap;
                }
                seglen = (uint)size;
                uVar24 = (ulong)(uint)s2Len;
                uVar21 = 0;
                local_1e0._8_8_ = lVar33;
                local_1e0._0_8_ = lVar33;
                local_1e0._16_8_ = lVar33;
                local_1e0._24_8_ = lVar33;
                auVar41 = ZEXT3264(local_1e0);
                iVar18 = iVar13;
                lVar28 = lVar33;
                lStack_1f8 = lVar19;
                lStack_1f0 = lVar19;
                lStack_1e8 = lVar19;
                lVar26 = lVar19;
                do {
                  if (uVar21 == uVar24) {
                    if (s2_end != 0) {
                      for (iVar14 = 0; iVar14 < iVar30; iVar14 = iVar14 + 1) {
                        auVar40 = auVar41._0_32_;
                        auVar38 = vperm2i128_avx2(auVar40,auVar40,8);
                        auVar38 = vpalignr_avx2(auVar40,auVar38,8);
                        auVar41 = ZEXT3264(auVar38);
                      }
                      lVar28 = vpextrq_avx(auVar41._16_16_,1);
                    }
                    uVar15 = uVar12;
                    if (s1_end != 0) {
                      for (uVar24 = 0; (seglen & 0x1fffffff) << 2 != (uint)uVar24;
                          uVar24 = uVar24 + 1) {
                        uVar22 = ((uint)uVar24 & 3) * seglen + ((uint)(uVar24 >> 2) & 0x3fffffff);
                        lVar35 = lVar28;
                        iVar14 = iVar13;
                        uVar11 = uVar15;
                        if (((int)uVar22 < (int)uVar2) &&
                           (lVar35 = (*ptr)[uVar24], iVar14 = iVar18, uVar11 = uVar22,
                           lVar35 <= lVar28)) {
                          if ((int)uVar15 <= (int)uVar22) {
                            uVar22 = uVar15;
                          }
                          if (iVar13 != iVar18) {
                            uVar22 = uVar15;
                          }
                          bVar36 = lVar35 == lVar28;
                          lVar35 = lVar28;
                          iVar14 = iVar13;
                          uVar11 = uVar15;
                          if (bVar36) {
                            uVar11 = uVar22;
                          }
                        }
                        uVar15 = uVar11;
                        iVar13 = iVar14;
                        lVar28 = lVar35;
                      }
                    }
                    iVar14 = (int)lVar28;
                    if (s2_end == 0 && s1_end == 0) {
                      alVar1 = ptr[uVar5];
                      for (iVar14 = 0; iVar14 < iVar30; iVar14 = iVar14 + 1) {
                        auVar38 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,
                                                  8);
                        alVar1 = (__m256i)vpalignr_avx2((undefined1  [32])alVar1,auVar38,8);
                      }
                      uVar29 = vpextrq_avx(alVar1._16_16_,1);
                      iVar14 = (int)uVar29;
                      iVar13 = iVar18;
                      uVar15 = uVar12;
                    }
                    auVar7._8_8_ = lVar33;
                    auVar7._0_8_ = lVar33;
                    auVar7._16_8_ = lVar33;
                    auVar7._24_8_ = lVar33;
                    auVar6._8_8_ = lStack_1f8;
                    auVar6._0_8_ = lVar26;
                    auVar6._16_8_ = lStack_1f0;
                    auVar6._24_8_ = lStack_1e8;
                    auVar38 = vpcmpgtq_avx2(auVar7,auVar6);
                    auVar8._8_8_ = lVar19;
                    auVar8._0_8_ = lVar19;
                    auVar8._16_8_ = lVar19;
                    auVar8._24_8_ = lVar19;
                    auVar40 = vpcmpgtq_avx2(local_1e0,auVar8);
                    auVar38 = vpor_avx2(auVar40,auVar38);
                    if ((((auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         SUB321(auVar38 >> 0x7f,0) != '\0') || SUB321(auVar38 >> 0xbf,0) != '\0') ||
                        auVar38[0x1f] < '\0') {
                      *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
                      iVar14 = 0;
                      iVar13 = 0;
                      uVar15 = 0;
                    }
                    ppVar16->score = iVar14;
                    ppVar16->end_query = uVar15;
                    ppVar16->end_ref = iVar13;
                    parasail_free(ptr_02);
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    return ppVar16;
                  }
                  auVar39 = auVar41._0_32_;
                  alVar1 = ptr[seglen - 1];
                  auVar37 = alVar1._0_16_;
                  auVar40._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar37;
                  auVar40._16_16_ = ZEXT116(0) * alVar1._16_16_ + ZEXT116(1) * auVar37;
                  auVar40 = vpalignr_avx2((undefined1  [32])alVar1,auVar40,8);
                  iVar31 = ppVar4->mapper[(byte)s2[uVar21]];
                  auVar40 = vpblendd_avx2(auVar40,ZEXT832((ulong)ptr_02[uVar21]),3);
                  lVar35 = 0;
                  auVar42._8_8_ = lVar33;
                  auVar42._0_8_ = lVar33;
                  auVar42._16_8_ = lVar33;
                  auVar42._24_8_ = lVar33;
                  uVar15 = s2Len;
                  palVar17 = ptr_00;
                  for (uVar32 = 0; ptr_00 = ptr, size != uVar32; uVar32 = uVar32 + 1) {
                    auVar40 = vpaddq_avx2(auVar40,*(undefined1 (*) [32])
                                                   ((long)pvVar3 +
                                                   lVar35 + (long)(int)(iVar31 * seglen) * 0x20));
                    auVar10 = *(undefined1 (*) [32])((long)*ptr_01 + lVar35);
                    alVar1[1]._0_4_ = in_stack_fffffffffffffd48;
                    alVar1[0] = (longlong)ptr_00;
                    alVar1[1]._4_4_ = iVar18;
                    alVar1[2]._0_4_ = uVar15;
                    alVar1[2]._4_4_ = in_register_00000014;
                    alVar1[3]._0_4_ = in_stack_fffffffffffffd58;
                    alVar1[3]._4_4_ = uVar12;
                    b[1] = (longlong)ptr_02;
                    b[0] = uVar21;
                    b[2] = (longlong)palVar17;
                    b[3] = lVar28;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,alVar1,b);
                    a[1]._0_4_ = in_stack_fffffffffffffd48;
                    a[0] = (longlong)ptr_00;
                    a[1]._4_4_ = iVar18;
                    a[2]._0_4_ = uVar15;
                    a[2]._4_4_ = in_register_00000014;
                    a[3]._0_4_ = in_stack_fffffffffffffd58;
                    a[3]._4_4_ = uVar12;
                    b_00[1] = (longlong)ptr_02;
                    b_00[0] = uVar21;
                    b_00[2] = (longlong)palVar17;
                    b_00[3] = lVar28;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a,b_00);
                    *(undefined1 (*) [32])((long)*palVar17 + lVar35) = auVar40;
                    a_00[1]._0_4_ = in_stack_fffffffffffffd48;
                    a_00[0] = (longlong)ptr_00;
                    a_00[1]._4_4_ = iVar18;
                    a_00[2]._0_4_ = uVar15;
                    a_00[2]._4_4_ = in_register_00000014;
                    a_00[3]._0_4_ = in_stack_fffffffffffffd58;
                    a_00[3]._4_4_ = uVar12;
                    b_01[1] = (longlong)ptr_02;
                    b_01[0] = uVar21;
                    b_01[2] = (longlong)palVar17;
                    b_01[3] = lVar28;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_01);
                    a_01[1]._0_4_ = in_stack_fffffffffffffd48;
                    a_01[0] = (longlong)ptr_00;
                    a_01[1]._4_4_ = iVar18;
                    a_01[2]._0_4_ = uVar15;
                    a_01[2]._4_4_ = in_register_00000014;
                    a_01[3]._0_4_ = in_stack_fffffffffffffd58;
                    a_01[3]._4_4_ = uVar12;
                    b_02[1] = (longlong)ptr_02;
                    b_02[0] = uVar21;
                    b_02[2] = (longlong)palVar17;
                    b_02[3] = lVar28;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_01,b_02);
                    a_02[1]._0_4_ = in_stack_fffffffffffffd48;
                    a_02[0] = (longlong)ptr_00;
                    a_02[1]._4_4_ = iVar18;
                    a_02[2]._0_4_ = uVar15;
                    a_02[2]._4_4_ = in_register_00000014;
                    a_02[3]._0_4_ = in_stack_fffffffffffffd58;
                    a_02[3]._4_4_ = uVar12;
                    b_03[1] = (longlong)ptr_02;
                    b_03[0] = uVar21;
                    b_03[2] = (longlong)palVar17;
                    b_03[3] = lVar28;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_02,b_03);
                    a_03[1]._0_4_ = in_stack_fffffffffffffd48;
                    a_03[0] = (longlong)ptr_00;
                    a_03[1]._4_4_ = iVar18;
                    a_03[2]._0_4_ = uVar15;
                    a_03[2]._4_4_ = in_register_00000014;
                    a_03[3]._0_4_ = in_stack_fffffffffffffd58;
                    a_03[3]._4_4_ = uVar12;
                    b_04[1] = (longlong)ptr_02;
                    b_04[0] = uVar21;
                    b_04[2] = (longlong)palVar17;
                    b_04[3] = lVar28;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,a_03,b_04);
                    __return_storage_ptr__ = (__m256i *)((ppVar16->field_4).rowcols)->score_row;
                    vH[1]._0_4_ = in_stack_fffffffffffffd48;
                    vH[0] = (longlong)ptr_00;
                    vH[1]._4_4_ = iVar18;
                    vH[2]._0_4_ = uVar15;
                    vH[2]._4_4_ = in_register_00000014;
                    vH[3]._0_4_ = in_stack_fffffffffffffd58;
                    vH[3]._4_4_ = uVar12;
                    arr_store_si256((int *)__return_storage_ptr__,vH,(int32_t)uVar32,seglen,
                                    (int32_t)uVar21,uVar15);
                    auVar9._8_4_ = open;
                    auVar9._0_8_ = uVar34;
                    auVar9._12_4_ = 0;
                    auVar9._16_4_ = open;
                    auVar9._20_4_ = 0;
                    auVar9._24_4_ = open;
                    auVar9._28_4_ = 0;
                    vpsubq_avx2(auVar40,auVar9);
                    auVar40 = vpsubq_avx2(auVar10,auVar38);
                    a_04[1]._0_4_ = in_stack_fffffffffffffd48;
                    a_04[0] = (longlong)ptr_00;
                    a_04[1]._4_4_ = iVar18;
                    a_04[2]._0_4_ = uVar15;
                    a_04[2]._4_4_ = in_register_00000014;
                    a_04[3]._0_4_ = in_stack_fffffffffffffd58;
                    a_04[3]._4_4_ = uVar12;
                    b_05[1] = (longlong)ptr_02;
                    b_05[0] = uVar21;
                    b_05[2] = (longlong)palVar17;
                    b_05[3] = lVar28;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_05);
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar35) = auVar40;
                    auVar42 = vpsubq_avx2(auVar42,auVar38);
                    a_05[1]._0_4_ = in_stack_fffffffffffffd48;
                    a_05[0] = (longlong)ptr_00;
                    a_05[1]._4_4_ = iVar18;
                    a_05[2]._0_4_ = uVar15;
                    a_05[2]._4_4_ = in_register_00000014;
                    a_05[3]._0_4_ = in_stack_fffffffffffffd58;
                    a_05[3]._4_4_ = uVar12;
                    b_06[1] = (longlong)ptr_02;
                    b_06[0] = uVar21;
                    b_06[2] = (longlong)palVar17;
                    b_06[3] = lVar28;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_06);
                    auVar40 = *(undefined1 (*) [32])((long)*ptr_00 + lVar35);
                    lVar35 = lVar35 + 0x20;
                    ptr = ptr_00;
                  }
                  s2Len = uVar15;
                  for (iVar31 = 0; ptr = palVar17, iVar31 != 4; iVar31 = iVar31 + 1) {
                    uVar32 = uVar23;
                    if (s2_beg == 0) {
                      uVar32 = ptr_02[uVar21 + 1] - uVar34;
                    }
                    auVar40 = vpermq_avx2(auVar42,0x90);
                    auVar42 = vpblendd_avx2(auVar40,ZEXT832(uVar32),3);
                    uVar32 = 0;
                    while (size != uVar32) {
                      local_260._0_8_ = (*palVar17)[0];
                      local_260._8_8_ = (*palVar17)[1];
                      local_260._16_8_ = (*palVar17)[2];
                      local_260._24_8_ = (*palVar17)[3];
                      a_06[1]._0_4_ = in_stack_fffffffffffffd48;
                      a_06[0] = (longlong)ptr_00;
                      a_06[1]._4_4_ = iVar18;
                      a_06[2]._0_4_ = s2Len;
                      a_06[2]._4_4_ = in_register_00000014;
                      a_06[3]._0_4_ = in_stack_fffffffffffffd58;
                      a_06[3]._4_4_ = uVar12;
                      b_07[1] = (longlong)ptr_02;
                      b_07[0] = uVar21;
                      b_07[2] = (longlong)ptr;
                      b_07[3] = lVar28;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_07);
                      (*palVar17)[0] = local_260._0_8_;
                      (*palVar17)[1] = local_260._8_8_;
                      (*palVar17)[2] = local_260._16_8_;
                      (*palVar17)[3] = local_260._24_8_;
                      a_07[1]._0_4_ = in_stack_fffffffffffffd48;
                      a_07[0] = (longlong)ptr_00;
                      a_07[1]._4_4_ = iVar18;
                      a_07[2]._0_4_ = s2Len;
                      a_07[2]._4_4_ = in_register_00000014;
                      a_07[3]._0_4_ = in_stack_fffffffffffffd58;
                      a_07[3]._4_4_ = uVar12;
                      b_08[1] = (longlong)ptr_02;
                      b_08[0] = uVar21;
                      b_08[2] = (longlong)ptr;
                      b_08[3] = lVar28;
                      _mm256_min_epi64_rpl(__return_storage_ptr__,a_07,b_08);
                      a_08[1]._0_4_ = in_stack_fffffffffffffd48;
                      a_08[0] = (longlong)ptr_00;
                      a_08[1]._4_4_ = iVar18;
                      a_08[2]._0_4_ = s2Len;
                      a_08[2]._4_4_ = in_register_00000014;
                      a_08[3]._0_4_ = in_stack_fffffffffffffd58;
                      a_08[3]._4_4_ = uVar12;
                      b_09[1] = (longlong)ptr_02;
                      b_09[0] = uVar21;
                      b_09[2] = (longlong)ptr;
                      b_09[3] = lVar28;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_08,b_09);
                      __return_storage_ptr__ = (__m256i *)((ppVar16->field_4).rowcols)->score_row;
                      vH_00[1]._0_4_ = in_stack_fffffffffffffd48;
                      vH_00[0] = (longlong)ptr_00;
                      vH_00[1]._4_4_ = iVar18;
                      vH_00[2]._0_4_ = s2Len;
                      vH_00[2]._4_4_ = in_register_00000014;
                      vH_00[3]._0_4_ = in_stack_fffffffffffffd58;
                      vH_00[3]._4_4_ = uVar12;
                      arr_store_si256((int *)__return_storage_ptr__,vH_00,(int32_t)uVar32,seglen,
                                      (int32_t)uVar21,uVar15);
                      auVar10._8_4_ = open;
                      auVar10._0_8_ = uVar34;
                      auVar10._12_4_ = 0;
                      auVar10._16_4_ = open;
                      auVar10._20_4_ = 0;
                      auVar10._24_4_ = open;
                      auVar10._28_4_ = 0;
                      auVar40 = vpsubq_avx2(local_260,auVar10);
                      auVar42 = vpsubq_avx2(auVar42,auVar38);
                      auVar40 = vpcmpgtq_avx2(auVar42,auVar40);
                      uVar32 = uVar32 + 1;
                      palVar17 = palVar17 + 1;
                      if ((((auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar40 >> 0x7f,0) == '\0') && SUB321(auVar40 >> 0xbf,0) == '\0')
                          && -1 < auVar40[0x1f]) goto LAB_00764600;
                    }
                    palVar17 = ptr;
                  }
LAB_00764600:
                  auVar41 = ZEXT3264((undefined1  [32])ptr[uVar5]);
                  auVar40 = vpcmpgtq_avx2((undefined1  [32])ptr[uVar5],auVar39);
                  a_09[1]._0_4_ = in_stack_fffffffffffffd48;
                  a_09[0] = (longlong)ptr_00;
                  a_09[1]._4_4_ = iVar18;
                  a_09[2]._0_4_ = s2Len;
                  a_09[2]._4_4_ = in_register_00000014;
                  a_09[3]._0_4_ = in_stack_fffffffffffffd58;
                  a_09[3]._4_4_ = uVar12;
                  b_10[1] = (longlong)ptr_02;
                  b_10[0] = uVar21;
                  b_10[2] = (longlong)ptr;
                  b_10[3] = lVar28;
                  _mm256_max_epi64_rpl(__return_storage_ptr__,a_09,b_10);
                  auVar39._8_8_ = -(ulong)(iVar30 == 2);
                  auVar39._0_8_ = -(ulong)(iVar30 == 3);
                  auVar39._16_8_ = -(ulong)(iVar30 == 1);
                  auVar39._24_8_ = -(ulong)(iVar14 == 3);
                  auVar39 = auVar39 & auVar40;
                  if ((((auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar39 >> 0x7f,0) != '\0') || SUB321(auVar39 >> 0xbf,0) != '\0') ||
                      auVar39[0x1f] < '\0') {
                    iVar13 = (int)uVar21;
                  }
                  uVar21 = uVar21 + 1;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar20 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_striped_profile_avx2_256_64",pcVar20);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvE      = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m256i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m256i vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 8);

        /* Correct part of the vProfile */
        const __m256i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m256i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vF = _mm256_slli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m256i vCompare;
            vH = _mm256_load_si256(pvHStore + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}